

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateGeneric::ConstraintsBiLoad_C
          (ChLinkMateGeneric *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  int iVar6;
  long lVar7;
  ChConstraintTwoBodies *pCVar8;
  long lVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar16 [64];
  ulong local_38;
  undefined1 auVar12 [16];
  
  auVar16._8_56_ = in_register_00001248;
  auVar16._0_8_ = recovery_clamp;
  iVar6 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])();
  if (((char)iVar6 != '\0') && (0 < (this->mask).nconstr)) {
    auVar10._8_8_ = 0x8000000000000000;
    auVar10._0_8_ = 0x8000000000000000;
    auVar10 = vxorpd_avx512vl(auVar16._0_16_,auVar10);
    lVar9 = 0;
    iVar6 = 0;
    do {
      if ((this->mask).nconstr <= lVar9) goto LAB_005b37cd;
      pCVar8 = (this->mask).constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9];
      if ((pCVar8->super_ChConstraintTwo).super_ChConstraint.active == true) {
        if (do_clamp) {
          cVar5 = (**(code **)((long)(pCVar8->super_ChConstraintTwo).super_ChConstraint.
                                     _vptr_ChConstraint + 0x18))();
          lVar7 = (long)(this->mask).nconstr;
          local_38 = auVar10._0_8_;
          if (cVar5 == '\0') {
            if (lVar7 <= lVar9) goto LAB_005b37cd;
            if ((iVar6 < 0) ||
               ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                m_rows <= (long)iVar6)) goto LAB_005b37ec;
            pCVar8 = (this->mask).constraints.
                     super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar9];
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_38;
            auVar14._8_8_ = 0;
            auVar14._0_8_ =
                 factor * (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
                          m_storage.m_data.array[iVar6];
            auVar4 = vmaxsd_avx(auVar14,auVar2);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = recovery_clamp;
            auVar4 = vminsd_avx(auVar4,auVar3);
            dVar11 = auVar4._0_8_;
          }
          else {
            if (lVar7 <= lVar9) {
LAB_005b37cd:
              __assert_fail("(i >= 0) && (i < nconstr)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                            ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
            }
            if ((iVar6 < 0) ||
               ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                m_rows <= (long)iVar6)) goto LAB_005b37ec;
            pCVar8 = (this->mask).constraints.
                     super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar9];
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_38;
            auVar12._8_8_ = 0;
            auVar12._0_8_ =
                 factor * (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
                          m_storage.m_data.array[iVar6];
            auVar4 = vmaxsd_avx(auVar12,auVar1);
            dVar11 = auVar4._0_8_;
          }
          (pCVar8->super_ChConstraintTwo).super_ChConstraint.b_i =
               dVar11 + (pCVar8->super_ChConstraintTwo).super_ChConstraint.b_i;
        }
        else {
          if ((iVar6 < 0) ||
             ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
              m_rows <= (long)iVar6)) {
LAB_005b37ec:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
                         );
          }
          auVar13._8_8_ = 0;
          auVar13._0_8_ =
               (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
               m_data.array[iVar6];
          auVar15._8_8_ = 0;
          auVar15._0_8_ = factor;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (pCVar8->super_ChConstraintTwo).super_ChConstraint.b_i;
          auVar4 = vfmadd213sd_fma(auVar13,auVar15,auVar4);
          (pCVar8->super_ChConstraintTwo).super_ChConstraint.b_i = auVar4._0_8_;
        }
        iVar6 = iVar6 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->mask).nconstr);
  }
  return;
}

Assistant:

void ChLinkMateGeneric::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    if (!this->IsActive())
        return;

    //***TEST***
    /*
        GetLog()<< "cload: " ;
        if (this->c_x) GetLog()<< " x";
        if (this->c_y) GetLog()<< " y";
        if (this->c_z) GetLog()<< " z";
        if (this->c_rx) GetLog()<< " Rx";
        if (this->c_ry) GetLog()<< " Ry";
        if (this->c_rz) GetLog()<< " Rz";
        GetLog()<< *this->C << "\n";
    */
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            if (do_clamp) {
                if (mask.Constr_N(i).IsUnilateral())
                    mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() +
                                              ChMax(factor * C(cnt), -recovery_clamp));
                else
                    mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() +
                                              ChMin(ChMax(factor * C(cnt), -recovery_clamp), recovery_clamp));
            } else
                mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() + factor * C(cnt));

            cnt++;
        }
    }
}